

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O1

int cppcms_capi_session_pool_init_from_json(cppcms_capi_session_pool *pool,char *json)

{
  bool bVar1;
  session_pool *this;
  runtime_error *this_00;
  int iVar2;
  value v;
  int line;
  ostringstream ss;
  istringstream f;
  value local_350;
  int local_344;
  allocator local_340 [32];
  undefined1 *local_320 [2];
  undefined1 local_310 [360];
  istringstream local_1a8 [120];
  ios_base local_130 [264];
  
  iVar2 = -1;
  if (pool != (cppcms_capi_session_pool *)0x0) {
    anon_unknown.dwarf_41bcbf::check_str(json);
    cppcms::json::value::copyable::copyable(&local_350.d);
    std::__cxx11::string::string((string *)local_320,json,local_340);
    std::__cxx11::istringstream::istringstream(local_1a8,(string *)local_320,_S_in);
    if (local_320[0] != local_310) {
      operator_delete(local_320[0]);
    }
    local_344 = 0;
    bVar1 = cppcms::json::value::load(&local_350,(istream *)local_1a8,true,&local_344);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"Failed to parse json syntax error in line ",0x2a);
      std::ostream::operator<<(local_320,local_344);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,(string *)local_340);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this = (session_pool *)operator_new(0x28);
    cppcms::session_pool::session_pool(this,&local_350);
    booster::hold_ptr<cppcms::session_pool>::reset(&pool->p,this);
    cppcms::session_pool::init((pool->p).ptr_,(EVP_PKEY_CTX *)this);
    std::__cxx11::istringstream::~istringstream(local_1a8);
    std::ios_base::~ios_base(local_130);
    cppcms::json::value::copyable::~copyable(&local_350.d);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int cppcms_capi_session_pool_init_from_json(cppcms_capi_session_pool *pool,char const *json)
{
	try {
		if(!pool)
			return -1;
		check_str(json);
		cppcms::json::value v;
		std::istringstream f(json);
		int line = 0;
		if(!v.load(f,true,&line)) {
			std::ostringstream ss;
			ss << "Failed to parse json syntax error in line " << line;
			throw std::runtime_error(ss.str());
		}
		pool->p.reset(new cppcms::session_pool(v));
		pool->p->init();
	} CATCH(pool,0,-1);
}